

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O0

void __thiscall CLI::RuntimeError::~RuntimeError(RuntimeError *this)

{
  RuntimeError *this_local;
  
  ~RuntimeError(this);
  operator_delete(this);
  return;
}

Assistant:

explicit RuntimeError(int exit_code = 1) : RuntimeError("Runtime error", exit_code) {}